

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# higher_order_functions.c
# Opt level: O1

int fun_zip_add_min_default(int *e1,int *e2,int count)

{
  int iVar1;
  ulong uVar2;
  int iVar3;
  
  if (0 < count) {
    iVar1 = 10000000;
    uVar2 = 0;
    do {
      if ((e1[uVar2] != 10000000) && (e2[uVar2] != 10000000)) {
        iVar3 = e2[uVar2] + e1[uVar2];
        if (iVar3 <= iVar1) {
          iVar1 = iVar3;
        }
      }
      uVar2 = uVar2 + 1;
    } while ((uint)count != uVar2);
    return iVar1;
  }
  return 10000000;
}

Assistant:

static int
fun_zip_add_min_default(const int *e1,
                        const int *e2,
                        int       count)
{
  int i;
  int decomp = INF;

  for (i = 0; i < count; i++) {
    if ((e1[i] != INF) && (e2[i] != INF)) {
      const int en = e1[i] + e2[i];
      decomp = MIN2(decomp, en);
    }
  }

  return decomp;
}